

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csharp_message.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::csharp::MessageGenerator::GenerateMessageSerializationMethods
          (MessageGenerator *this,Printer *printer)

{
  int iVar1;
  int iVar2;
  FieldDescriptor *descriptor;
  FieldGeneratorBase *__p;
  pointer pFVar3;
  unique_ptr<google::protobuf::compiler::csharp::FieldGeneratorBase,_std::default_delete<google::protobuf::compiler::csharp::FieldGeneratorBase>_>
  local_28;
  unique_ptr<google::protobuf::compiler::csharp::FieldGeneratorBase,_std::default_delete<google::protobuf::compiler::csharp::FieldGeneratorBase>_>
  generator;
  int i;
  Printer *printer_local;
  MessageGenerator *this_local;
  
  SourceGeneratorBase::WriteGeneratedCodeAttributes(&this->super_SourceGeneratorBase,printer);
  io::Printer::Print<>(printer,"public void WriteTo(pb::CodedOutputStream output) {\n");
  io::Printer::Print<>(printer,"#if !GOOGLE_PROTOBUF_REFSTRUCT_COMPATIBILITY_MODE\n");
  io::Printer::Indent(printer);
  io::Printer::Print<>(printer,"output.WriteRawMessage(this);\n");
  io::Printer::Outdent(printer);
  io::Printer::Print<>(printer,"#else\n");
  io::Printer::Indent(printer);
  GenerateWriteToBody(this,printer,false);
  io::Printer::Outdent(printer);
  io::Printer::Print<>(printer,"#endif\n");
  io::Printer::Print<>(printer,"}\n\n");
  io::Printer::Print<>(printer,"#if !GOOGLE_PROTOBUF_REFSTRUCT_COMPATIBILITY_MODE\n");
  SourceGeneratorBase::WriteGeneratedCodeAttributes(&this->super_SourceGeneratorBase,printer);
  io::Printer::Print<>
            (printer,"void pb::IBufferMessage.InternalWriteTo(ref pb::WriteContext output) {\n");
  io::Printer::Indent(printer);
  GenerateWriteToBody(this,printer,true);
  io::Printer::Outdent(printer);
  io::Printer::Print<>(printer,"}\n");
  io::Printer::Print<>(printer,"#endif\n\n");
  SourceGeneratorBase::WriteGeneratedCodeAttributes(&this->super_SourceGeneratorBase,printer);
  io::Printer::Print<>(printer,"public int CalculateSize() {\n");
  io::Printer::Indent(printer);
  io::Printer::Print<>(printer,"int size = 0;\n");
  generator._M_t.
  super___uniq_ptr_impl<google::protobuf::compiler::csharp::FieldGeneratorBase,_std::default_delete<google::protobuf::compiler::csharp::FieldGeneratorBase>_>
  ._M_t.
  super__Tuple_impl<0UL,_google::protobuf::compiler::csharp::FieldGeneratorBase_*,_std::default_delete<google::protobuf::compiler::csharp::FieldGeneratorBase>_>
  .super__Head_base<0UL,_google::protobuf::compiler::csharp::FieldGeneratorBase_*,_false>.
  _M_head_impl._4_4_ = 0;
  while( true ) {
    iVar1 = generator._M_t.
            super___uniq_ptr_impl<google::protobuf::compiler::csharp::FieldGeneratorBase,_std::default_delete<google::protobuf::compiler::csharp::FieldGeneratorBase>_>
            ._M_t.
            super__Tuple_impl<0UL,_google::protobuf::compiler::csharp::FieldGeneratorBase_*,_std::default_delete<google::protobuf::compiler::csharp::FieldGeneratorBase>_>
            .super__Head_base<0UL,_google::protobuf::compiler::csharp::FieldGeneratorBase_*,_false>.
            _M_head_impl._4_4_;
    iVar2 = Descriptor::field_count(this->descriptor_);
    if (iVar2 <= iVar1) break;
    descriptor = Descriptor::field(this->descriptor_,
                                   generator._M_t.
                                   super___uniq_ptr_impl<google::protobuf::compiler::csharp::FieldGeneratorBase,_std::default_delete<google::protobuf::compiler::csharp::FieldGeneratorBase>_>
                                   ._M_t.
                                   super__Tuple_impl<0UL,_google::protobuf::compiler::csharp::FieldGeneratorBase_*,_std::default_delete<google::protobuf::compiler::csharp::FieldGeneratorBase>_>
                                   .
                                   super__Head_base<0UL,_google::protobuf::compiler::csharp::FieldGeneratorBase_*,_false>
                                   ._M_head_impl._4_4_);
    __p = CreateFieldGeneratorInternal(this,descriptor);
    std::
    unique_ptr<google::protobuf::compiler::csharp::FieldGeneratorBase,std::default_delete<google::protobuf::compiler::csharp::FieldGeneratorBase>>
    ::unique_ptr<std::default_delete<google::protobuf::compiler::csharp::FieldGeneratorBase>,void>
              ((unique_ptr<google::protobuf::compiler::csharp::FieldGeneratorBase,std::default_delete<google::protobuf::compiler::csharp::FieldGeneratorBase>>
                *)&local_28,__p);
    pFVar3 = std::
             unique_ptr<google::protobuf::compiler::csharp::FieldGeneratorBase,_std::default_delete<google::protobuf::compiler::csharp::FieldGeneratorBase>_>
             ::operator->(&local_28);
    (*(pFVar3->super_SourceGeneratorBase)._vptr_SourceGeneratorBase[0xc])(pFVar3,printer);
    std::
    unique_ptr<google::protobuf::compiler::csharp::FieldGeneratorBase,_std::default_delete<google::protobuf::compiler::csharp::FieldGeneratorBase>_>
    ::~unique_ptr(&local_28);
    generator._M_t.
    super___uniq_ptr_impl<google::protobuf::compiler::csharp::FieldGeneratorBase,_std::default_delete<google::protobuf::compiler::csharp::FieldGeneratorBase>_>
    ._M_t.
    super__Tuple_impl<0UL,_google::protobuf::compiler::csharp::FieldGeneratorBase_*,_std::default_delete<google::protobuf::compiler::csharp::FieldGeneratorBase>_>
    .super__Head_base<0UL,_google::protobuf::compiler::csharp::FieldGeneratorBase_*,_false>.
    _M_head_impl._4_4_ =
         generator._M_t.
         super___uniq_ptr_impl<google::protobuf::compiler::csharp::FieldGeneratorBase,_std::default_delete<google::protobuf::compiler::csharp::FieldGeneratorBase>_>
         ._M_t.
         super__Tuple_impl<0UL,_google::protobuf::compiler::csharp::FieldGeneratorBase_*,_std::default_delete<google::protobuf::compiler::csharp::FieldGeneratorBase>_>
         .super__Head_base<0UL,_google::protobuf::compiler::csharp::FieldGeneratorBase_*,_false>.
         _M_head_impl._4_4_ + 1;
  }
  if ((this->has_extension_ranges_ & 1U) != 0) {
    io::Printer::Print<>
              (printer,"if (_extensions != null) {\n  size += _extensions.CalculateSize();\n}\n");
  }
  io::Printer::Print<>
            (printer,"if (_unknownFields != null) {\n  size += _unknownFields.CalculateSize();\n}\n"
            );
  io::Printer::Print<>(printer,"return size;\n");
  io::Printer::Outdent(printer);
  io::Printer::Print<>(printer,"}\n\n");
  return;
}

Assistant:

void MessageGenerator::GenerateMessageSerializationMethods(io::Printer* printer) {
  WriteGeneratedCodeAttributes(printer);
  printer->Print(
      "public void WriteTo(pb::CodedOutputStream output) {\n");
  printer->Print("#if !GOOGLE_PROTOBUF_REFSTRUCT_COMPATIBILITY_MODE\n");
  printer->Indent();
  printer->Print("output.WriteRawMessage(this);\n");
  printer->Outdent();
  printer->Print("#else\n");
  printer->Indent();
  GenerateWriteToBody(printer, false);
  printer->Outdent();
  printer->Print("#endif\n");
  printer->Print("}\n\n");

  printer->Print("#if !GOOGLE_PROTOBUF_REFSTRUCT_COMPATIBILITY_MODE\n");
  WriteGeneratedCodeAttributes(printer);
  printer->Print("void pb::IBufferMessage.InternalWriteTo(ref pb::WriteContext output) {\n");
  printer->Indent();
  GenerateWriteToBody(printer, true);
  printer->Outdent();
  printer->Print("}\n");
  printer->Print("#endif\n\n");

  WriteGeneratedCodeAttributes(printer);
  printer->Print(
    "public int CalculateSize() {\n");
  printer->Indent();
  printer->Print("int size = 0;\n");
  for (int i = 0; i < descriptor_->field_count(); i++) {
    std::unique_ptr<FieldGeneratorBase> generator(
        CreateFieldGeneratorInternal(descriptor_->field(i)));
    generator->GenerateSerializedSizeCode(printer);
  }

  if (has_extension_ranges_) {
    printer->Print(
      "if (_extensions != null) {\n"
      "  size += _extensions.CalculateSize();\n"
      "}\n");
  }

  printer->Print(
    "if (_unknownFields != null) {\n"
    "  size += _unknownFields.CalculateSize();\n"
    "}\n");

  printer->Print("return size;\n");
  printer->Outdent();
  printer->Print("}\n\n");
}